

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdthreads.cc
# Opt level: O3

pthread_t createThread(bdThread *thread)

{
  pthread_t tid;
  pthread_t local_20;
  
  pthread_mutex_lock((pthread_mutex_t *)&thread->mMutex);
  pthread_create(&local_20,(pthread_attr_t *)0x0,bdthread_init,thread);
  thread->mTid = local_20;
  pthread_mutex_unlock((pthread_mutex_t *)&thread->mMutex);
  return local_20;
}

Assistant:

pthread_t createThread(bdThread &thread) {
    pthread_t tid;
    void  *data = (void *) (&thread);

#ifdef DEBUG_THREADS
    std::cerr << "createThread() creating a bdThread";
    std::cerr << std::endl;
#endif

    thread.mMutex.lock();
    {
      	pthread_create(&tid, 0, &bdthread_init, data);
      	thread.mTid = tid;
    }

#ifdef DEBUG_THREADS
    std::cerr << "createThread() created Thread.mTid: ";

#if defined(_WIN32) || defined(__MINGW32__)
    std::cerr << "WIN32: Cannot print mTid ";
#else
    std::cerr << thread.mTid;
#endif
    std::cerr << std::endl;

#endif

    thread.mMutex.unlock();

    return tid;

}